

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb_fastpforlib::internal::__fastunpack4(uint32_t *in,uint32_t *out)

{
  uint32_t *puVar1;
  uint uVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [16];
  uint32_t outer;
  long lVar6;
  undefined1 auVar7 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  undefined1 auVar8 [16];
  long lVar12;
  undefined1 in_XMM5 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  auVar5 = _DAT_0147f5c0;
  outer = 0;
  do {
    uVar2 = *in;
    auVar7._4_4_ = uVar2;
    auVar7._0_4_ = uVar2;
    auVar7._8_4_ = uVar2;
    auVar7._12_4_ = uVar2;
    lVar6 = 0;
    auVar8 = auVar5;
    do {
      auVar13 = pshuflw(in_XMM5,auVar8,0xfe);
      auVar14 = pshuflw(auVar13,auVar8,0x54);
      iVar9 = auVar8._4_4_;
      iVar10 = auVar8._8_4_;
      iVar11 = auVar8._12_4_;
      auVar15._0_8_ = auVar8._8_8_;
      auVar15._8_4_ = iVar10;
      auVar15._12_4_ = iVar11;
      auVar16 = pshuflw(in_XMM8,auVar15,0xfe);
      lVar12 = auVar16._0_8_;
      auVar3._4_8_ = auVar7._8_8_;
      auVar3._0_4_ = uVar2 >> lVar12;
      auVar17._0_8_ = auVar3._0_8_ << 0x20;
      auVar17._8_4_ = uVar2 >> lVar12;
      auVar17._12_4_ = uVar2 >> lVar12;
      in_XMM5 = pshuflw(auVar15,auVar15,0x54);
      lVar12 = in_XMM5._0_8_;
      auVar4._4_8_ = auVar7._8_8_;
      auVar4._0_4_ = uVar2 >> lVar12;
      auVar16._0_8_ = auVar4._0_8_ << 0x20;
      auVar16._8_4_ = uVar2 >> lVar12;
      auVar16._12_4_ = uVar2 >> lVar12;
      in_XMM8._8_8_ = auVar17._8_8_;
      in_XMM8._0_8_ = auVar16._8_8_;
      puVar1 = out + lVar6;
      *puVar1 = uVar2 >> auVar14._0_8_ & 0xf;
      puVar1[1] = uVar2 >> auVar13._0_8_ & 0xf;
      puVar1[2] = auVar16._8_4_ & 0xf;
      puVar1[3] = auVar17._12_4_ & 0xf;
      lVar6 = lVar6 + 4;
      auVar8._0_4_ = auVar8._0_4_ + 0x10;
      auVar8._4_4_ = iVar9 + 0x10;
      auVar8._8_4_ = iVar10 + 0x10;
      auVar8._12_4_ = iVar11 + 0x10;
    } while (lVar6 != 8);
    in = in + 1;
    outer = outer + 1;
    out = out + 8;
  } while (outer != 4);
  return;
}

Assistant:

void __fastunpack4(const uint32_t *__restrict in, uint32_t *__restrict out) {
	for (uint32_t outer = 0; outer < 4; ++outer) {
		for (uint32_t inwordpointer = 0; inwordpointer < 32; inwordpointer += 4)
			*(out++) = ((*in) >> inwordpointer) % (1U << 4);
		++in;
	}
}